

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O2

bool mg::data::mzx_decompress(string *compressed,string *out,bool invert)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 unaff_RBX;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  byte bVar9;
  ushort uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  uint16_t auStack_b8 [4];
  uint16_t ring_buffer [64];
  
  if (compressed->_M_string_length < 8) {
    fwrite("Header too small\n",0x11,1,_stderr);
    uVar4 = 0;
  }
  else {
    bVar16 = (int)*(undefined8 *)(compressed->_M_dataplus)._M_p == 0x30585a4d;
    uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar16);
    if (bVar16) {
      ring_buffer._124_4_ = (undefined4)uVar4;
      std::__cxx11::string::resize((ulong)out);
      bVar14 = -invert;
      uVar8 = (ushort)bVar14;
      auVar18 = pshuflw(ZEXT216(CONCAT11(bVar14,bVar14)),ZEXT216(CONCAT11(bVar14,bVar14)),0);
      uVar17 = auVar18._0_4_;
      ring_buffer[0x34] = (uint16_t)uVar17;
      ring_buffer[0x35] = SUB42(uVar17,2);
      ring_buffer[0x36] = (uint16_t)uVar17;
      ring_buffer[0x37] = SUB42(uVar17,2);
      ring_buffer[0x38] = (uint16_t)uVar17;
      ring_buffer[0x39] = SUB42(uVar17,2);
      ring_buffer[0x3a] = (uint16_t)uVar17;
      ring_buffer[0x3b] = SUB42(uVar17,2);
      ring_buffer[0x2c] = (uint16_t)uVar17;
      ring_buffer[0x2d] = SUB42(uVar17,2);
      ring_buffer[0x2e] = (uint16_t)uVar17;
      ring_buffer[0x2f] = SUB42(uVar17,2);
      ring_buffer[0x30] = (uint16_t)uVar17;
      ring_buffer[0x31] = SUB42(uVar17,2);
      ring_buffer[0x32] = (uint16_t)uVar17;
      ring_buffer[0x33] = SUB42(uVar17,2);
      ring_buffer[0x24] = (uint16_t)uVar17;
      ring_buffer[0x25] = SUB42(uVar17,2);
      ring_buffer[0x26] = (uint16_t)uVar17;
      ring_buffer[0x27] = SUB42(uVar17,2);
      ring_buffer[0x28] = (uint16_t)uVar17;
      ring_buffer[0x29] = SUB42(uVar17,2);
      ring_buffer[0x2a] = (uint16_t)uVar17;
      ring_buffer[0x2b] = SUB42(uVar17,2);
      ring_buffer[0x1c] = (uint16_t)uVar17;
      ring_buffer[0x1d] = SUB42(uVar17,2);
      ring_buffer[0x1e] = (uint16_t)uVar17;
      ring_buffer[0x1f] = SUB42(uVar17,2);
      ring_buffer[0x20] = (uint16_t)uVar17;
      ring_buffer[0x21] = SUB42(uVar17,2);
      ring_buffer[0x22] = (uint16_t)uVar17;
      ring_buffer[0x23] = SUB42(uVar17,2);
      ring_buffer[0x14] = (uint16_t)uVar17;
      ring_buffer[0x15] = SUB42(uVar17,2);
      ring_buffer[0x16] = (uint16_t)uVar17;
      ring_buffer[0x17] = SUB42(uVar17,2);
      ring_buffer[0x18] = (uint16_t)uVar17;
      ring_buffer[0x19] = SUB42(uVar17,2);
      ring_buffer[0x1a] = (uint16_t)uVar17;
      ring_buffer[0x1b] = SUB42(uVar17,2);
      ring_buffer[0xc] = (uint16_t)uVar17;
      ring_buffer[0xd] = SUB42(uVar17,2);
      ring_buffer[0xe] = (uint16_t)uVar17;
      ring_buffer[0xf] = SUB42(uVar17,2);
      ring_buffer[0x10] = (uint16_t)uVar17;
      ring_buffer[0x11] = SUB42(uVar17,2);
      ring_buffer[0x12] = (uint16_t)uVar17;
      ring_buffer[0x13] = SUB42(uVar17,2);
      ring_buffer[4] = (uint16_t)uVar17;
      ring_buffer[5] = SUB42(uVar17,2);
      ring_buffer[6] = (uint16_t)uVar17;
      ring_buffer[7] = SUB42(uVar17,2);
      ring_buffer[8] = (uint16_t)uVar17;
      ring_buffer[9] = SUB42(uVar17,2);
      ring_buffer[10] = (uint16_t)uVar17;
      ring_buffer[0xb] = SUB42(uVar17,2);
      auStack_b8[0] = (uint16_t)uVar17;
      auStack_b8[1] = SUB42(uVar17,2);
      auStack_b8[2] = (uint16_t)uVar17;
      auStack_b8[3] = SUB42(uVar17,2);
      ring_buffer[0] = (uint16_t)uVar17;
      ring_buffer[1] = SUB42(uVar17,2);
      ring_buffer[2] = (uint16_t)uVar17;
      ring_buffer[3] = SUB42(uVar17,2);
      uVar2 = 0;
      uVar6 = 0;
      ring_buffer._120_4_ = ZEXT14(bVar14);
      uVar4 = 8;
      bVar16 = false;
      uVar10 = uVar8;
      while (uVar4 < compressed->_M_string_length) {
        uVar5 = uVar4 + 1;
        pcVar1 = (compressed->_M_dataplus)._M_p;
        bVar7 = pcVar1[uVar4];
        bVar9 = bVar7 >> 2;
        bVar15 = bVar16;
        if (!bVar16) {
          uVar10 = (ushort)bVar14;
          bVar15 = true;
        }
        uVar8 = uVar8 & 0xff;
        if (!bVar16) {
          uVar8 = (ushort)bVar14;
        }
        uVar12 = (uint)bVar9;
        bVar16 = bVar15;
        switch(bVar7 & 3) {
        case 0:
          iVar13 = uVar12 + 1;
          while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, uVar4 = uVar5, bVar15) {
            uVar4 = out->_M_string_length;
            if (uVar2 < uVar4) {
              (out->_M_dataplus)._M_p[uVar2] = (char)uVar8;
              uVar2 = uVar2 + 1;
              uVar4 = out->_M_string_length;
            }
            if (uVar2 < uVar4) {
              (out->_M_dataplus)._M_p[uVar2] = (char)uVar10;
              uVar2 = uVar2 + 1;
            }
          }
          break;
        case 1:
          bVar7 = pcVar1[uVar5];
          iVar13 = uVar12 + 1;
          while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
            lVar11 = uVar2 - (uint)bVar7 * 2;
            pcVar1 = (out->_M_dataplus)._M_p;
            uVar5 = out->_M_string_length;
            uVar8 = (ushort)(byte)pcVar1[lVar11 + -2];
            bVar9 = pcVar1[lVar11 + -1];
            uVar10 = (ushort)bVar9;
            if (uVar2 < uVar5) {
              pcVar1[uVar2] = pcVar1[lVar11 + -2];
              uVar2 = uVar2 + 1;
              uVar5 = out->_M_string_length;
            }
            if (uVar2 < uVar5) {
              (out->_M_dataplus)._M_p[uVar2] = bVar9;
              uVar2 = uVar2 + 1;
            }
          }
          uVar4 = uVar4 + 2;
          break;
        case 2:
          uVar8 = auStack_b8[bVar9];
          uVar3 = out->_M_string_length;
          if (uVar2 < uVar3) {
            (out->_M_dataplus)._M_p[uVar2] = (char)uVar8;
            uVar2 = uVar2 + 1;
            uVar3 = out->_M_string_length;
          }
          uVar10 = uVar8 >> 8;
          uVar4 = uVar5;
          if (uVar2 < uVar3) {
            (out->_M_dataplus)._M_p[uVar2] = (char)(uVar8 >> 8);
            uVar2 = uVar2 + 1;
          }
          break;
        case 3:
          iVar13 = uVar12 + 1;
          while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, uVar4 = uVar5, bVar15) {
            pcVar1 = (compressed->_M_dataplus)._M_p;
            bVar7 = pcVar1[uVar5] ^ (byte)ring_buffer._120_4_;
            uVar8 = (ushort)bVar7;
            bVar9 = pcVar1[uVar5 + 1] ^ (byte)ring_buffer._120_4_;
            uVar10 = (ushort)bVar9;
            uVar4 = out->_M_string_length;
            if (uVar2 < uVar4) {
              (out->_M_dataplus)._M_p[uVar2] = bVar7;
              uVar2 = uVar2 + 1;
              uVar4 = out->_M_string_length;
            }
            if (uVar2 < uVar4) {
              (out->_M_dataplus)._M_p[uVar2] = bVar9;
              uVar2 = uVar2 + 1;
            }
            auStack_b8[uVar6] = CONCAT11(bVar9,bVar7);
            uVar6 = (ulong)((int)uVar6 + 1U & 0x3f);
            uVar5 = uVar5 + 2;
          }
        }
      }
      uVar4 = (ulong)(uint)ring_buffer._124_4_;
    }
    else {
      fwrite("Invalid file magic\n",0x13,1,_stderr);
    }
  }
  return (bool)(char)uVar4;
}

Assistant:

bool mzx_decompress(const std::string &compressed, std::string &out,
                    bool invert) {
  // If header is too small, bail immediately
  if (compressed.size() < sizeof(MzxHeader)) {
    fprintf(stderr, "Header too small\n");
    return false;
  }

  // Pun start of data stream into header
  MzxHeader header = *reinterpret_cast<const MzxHeader *>(compressed.data());
  header.to_host_order();

  // If the magic doesn't match, do not try and uncompress
  if (memcmp(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic)) != 0) {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }

  // Resize output buffer to accomodate decompressed data
  out.resize(header.decompressed_size);

  // Last written short
  uint8_t last[2];
  memset(last, invert ? 0xFF : 0x00, sizeof(last));

  // Ring buffer
  uint16_t ring_buffer[64];
  memset(ring_buffer, invert ? 0xFF : 0x00, sizeof(ring_buffer));

  // Clear counter. Last data is reinitialized on zero.
  int clear_count = 0;

  // Start reading right after the header
  std::string::size_type read_offset = sizeof(MzxHeader);
  std::string::size_type decompress_offset = 0;
  unsigned ring_buffer_write_offset = 0;
  while (read_offset < compressed.size()) {
    // Get type / len
    const uint8_t len_cmd = compressed[read_offset++];
    const unsigned cmd = len_cmd & 0b11;
    const unsigned len = len_cmd >> 2;

    // Reset counter
    if (clear_count <= 0) {
      clear_count = 0x1000;
      memset(last, invert ? 0xFF : 0x00, sizeof(last));
    }

    auto emit_byte = [&](uint8_t byte) {
      if (decompress_offset >= out.size()) {
        // fprintf(stderr, "Tried to write %d bytes past end of buffer: %02x\n",
        //         (int)decompress_offset - (int)out.size(), byte);
        return;
      }
      out[decompress_offset++] = byte;
    };

    switch (cmd) {

    case CMD_RLE: {
      // Repeat last two bytes len + 1 times
      for (unsigned i = 0; i <= len; i++) {
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_BACKREF: {
      const int lookback_distance =
          2 * (static_cast<uint8_t>(compressed[read_offset++]) + 1);
      for (unsigned i = 0; i <= len; i++) {
        const std::string::size_type lookback_offset =
            decompress_offset - lookback_distance;

        // Read 2 bytes into last buffer
        last[0] = out[lookback_offset];
        last[1] = out[lookback_offset + 1];

        // Write those bytes to end of stream
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_RINGBUF: {
      // Load ring buffer data at position len into last
      *reinterpret_cast<uint16_t *>(last) = ring_buffer[len];

      // Emit last
      emit_byte(last[0]);
      emit_byte(last[1]);
    } break;

    case CMD_LITERAL: {
      for (unsigned i = 0; i <= len; i++) {
        const uint8_t r0 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);
        const uint8_t r1 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);

        // Update last
        last[0] = r0;
        last[1] = r1;

        // Emit data
        emit_byte(last[0]);
        emit_byte(last[1]);

        // Write to ring buffer
        ring_buffer[ring_buffer_write_offset++] = (r1 << 8) | r0;
        ring_buffer_write_offset &= 0x3f;
      }
      break;
    }
    }
  }

  return true;
}